

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_printer.hpp
# Opt level: O2

ostream * boost::unit_test::utils::operator<<
                    (custom_printer<boost::unit_test::utils::custom_manip<boost::unit_test::utils::attr_value_t>_>
                     *p,char (*value) [6])

{
  std::operator<<(p->m_ostr,"=\"");
  std::operator<<(p->m_ostr,*value);
  std::operator<<(p->m_ostr,'\"');
  return p->m_ostr;
}

Assistant:

inline std::ostream&
operator<<( custom_printer<attr_value> const& p, T const& value )
{
    *p << "=\"";
    print_escaped( *p, value );
    *p << '"';

    return *p;
}